

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateLSTMWeightParams
                   (Result *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
                   LSTMParams *lstmParams)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  WeightParamType *wt;
  undefined1 *puVar6;
  pointer pWVar7;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *__range1;
  int iVar8;
  uint uVar9;
  WeightParamType WVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_58;
  string local_40;
  
  bVar13 = lstmParams->hasbiasvectors_;
  bVar1 = lstmParams->haspeepholevectors_;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  puVar6 = (undefined1 *)lstmWeightParams->inputgateweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  uVar9 = 4;
  if (uVar12 - uVar5 < 2) {
    uVar9 = 5;
    if (uVar12 != uVar5) {
      uVar9 = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (uVar9 = 2, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (uVar9 = 3, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      uVar9 = 5;
    }
  }
  local_40._M_dataplus._M_p._0_4_ = uVar9;
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_58,(iterator)0x0,(WeightParamType *)&local_40);
  puVar6 = (undefined1 *)lstmWeightParams->forgetgateweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if ((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
       ((((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->blockinputweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->outputgateweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->inputgaterecursionmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->forgetgaterecursionmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->blockinputrecursionmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
        (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)lstmWeightParams->outputgaterecursionmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar12 = (0 < iVar8) + 1;
  if (lVar2 == 0) {
    uVar12 = (uint)(0 < iVar8);
  }
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar12 = (uVar12 - (lVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
    }
    if ((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
       ((((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar13 != false) {
    puVar6 = (undefined1 *)lstmWeightParams->inputgatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    WVar10 = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      WVar10 = EMPTY;
      if (uVar12 != uVar5) {
        WVar10 = (uint)(iVar8 < 1);
      }
      if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
          (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (WVar10 = QUINT, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0))))
         && (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
             (WVar10 = QINT, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))
         ) {
        WVar10 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar10;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar10;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)lstmWeightParams->forgetgatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
      }
      if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
          (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)lstmWeightParams->blockinputbiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
      }
      if ((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
         ((((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
          (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)lstmWeightParams->outputgatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
      }
      if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
          (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (bVar1 != false) {
    puVar6 = (undefined1 *)lstmWeightParams->inputgatepeepholevector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    WVar10 = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      WVar10 = EMPTY;
      if (uVar12 != uVar5) {
        WVar10 = (uint)(iVar8 < 1);
      }
      if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
          (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (WVar10 = QUINT, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0))))
         && (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
             (WVar10 = QINT, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))
         ) {
        WVar10 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar10;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar10;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)lstmWeightParams->forgetgatepeepholevector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
      }
      if ((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
         ((((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
          (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)lstmWeightParams->outputgatepeepholevector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar8 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar12 = (0 < iVar8) + 1;
    if (lVar2 == 0) {
      uVar12 = (uint)(0 < iVar8);
    }
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar5 = (uint)(lVar4 == 0);
    uVar12 = (uVar12 - (lVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar8 < 1);
      }
      if (((((lVar2 == 0) && (uVar12 != uVar5)) && (iVar8 < 1)) &&
          (((lVar3 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar4 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  bVar13 = local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar13) {
    iVar8 = 0;
    iVar11 = 0;
    pWVar7 = local_58.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar7 == FLOAT16) {
        iVar11 = iVar11 + 1;
      }
      else if (*pWVar7 == FLOAT32) {
        iVar8 = iVar8 + 1;
      }
      if (0 < iVar8 * iVar11) break;
      pWVar7 = pWVar7 + 1;
      bVar13 = pWVar7 == local_58.
                         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar13);
  }
  if (bVar13) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
               ,"");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();

    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}